

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortA.c
# Opt level: O2

int bursttraverseA(TRIE_conflict *node,string *strings,int pos,unsigned_short deep)

{
  uchar **a;
  char **ppcVar1;
  uint uVar2;
  ulong uVar3;
  int depth;
  undefined6 in_register_0000000a;
  int pos_00;
  ulong uVar4;
  uint uVar5;
  char **__ptr;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  uVar4 = (ulong)(uint)pos;
  depth = (int)CONCAT62(in_register_0000000a,deep) + 1;
  for (lVar8 = 0; pos_00 = (int)uVar4, lVar8 != 0x100; lVar8 = lVar8 + 1) {
    uVar2 = node->counts[lVar8];
    if (uVar2 != 0) {
      if (uVar2 == 0xffffffff) {
        uVar2 = bursttraverseA((TRIE_conflict *)node->ptrs[lVar8],strings,pos_00,
                               (unsigned_short)depth);
        uVar4 = (ulong)uVar2;
      }
      else if (lVar8 == 0) {
        uVar5 = (int)uVar2 / 0x1fff + 1U & 0xffff;
        __ptr = node->ptrs[0];
        for (uVar7 = 1; uVar7 != uVar5 + 1; uVar7 = uVar7 + 1) {
          uVar3 = 0x1fff;
          if (uVar7 == uVar5) {
            uVar3 = (ulong)((int)uVar2 % 0x1fff & 0xffff);
          }
          for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
            strings[(long)(int)uVar4 + uVar6] = (string)__ptr[uVar6];
          }
          uVar4 = (ulong)(uint)((int)uVar4 + (int)uVar6);
          ppcVar1 = (char **)__ptr[uVar3];
          free(__ptr);
          __ptr = ppcVar1;
        }
      }
      else {
        uVar3 = 0;
        if (0 < (int)uVar2) {
          uVar3 = (ulong)uVar2;
        }
        a = strings + pos_00;
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          a[uVar6] = (uchar *)node->ptrs[lVar8][uVar6];
        }
        uVar4 = (uVar4 & 0xffffffff) + uVar6;
        free(node->ptrs[lVar8]);
        if (1 < (int)uVar2) {
          if (uVar2 < 0x14) {
            inssort(a,(int)uVar6,depth);
          }
          else {
            mkqsort(a,(int)uVar6,depth);
          }
        }
      }
    }
  }
  free(node);
  return pos_00;
}

Assistant:

static int
bursttraverseA(TRIE *node, string strings[], int pos, unsigned short deep)
{
    int i, j, k; 
    int off = 0;
    unsigned short no_of_buckets=0, no_elements_in_last_bucket=0, no_elements_in_bucket=0; 
    char **nullbucket, **headbucket;
    int count;

    for( i=0 ; i < ALPHABET; i++)
    {
        count = node->counts[i];

        if( !++count )
        {
            pos = bursttraverseA((TRIE *) node->ptrs[i], strings, pos, deep+1);
        }
        else if (--count)
        {
            if(i==0)
            {
                no_of_buckets = (count/THRESHOLDMINUSONE) + 1;
                no_elements_in_last_bucket = count % THRESHOLDMINUSONE;
                nullbucket = node->ptrs[i];
                headbucket = node->ptrs[i];
                off=pos;

                /* traverse all arrays in the bucket */
                for (k=1; k <= no_of_buckets; k++)
                {
                    if(k==no_of_buckets)
                        no_elements_in_bucket = no_elements_in_last_bucket;
                    else
                        no_elements_in_bucket = THRESHOLDMINUSONE;

                    /* traverse all elements in each bucket */
                    for (j=0; j < no_elements_in_bucket ; j++, off++) 
                    {
			strings[off] = (unsigned char*) nullbucket[j];
                    }
                    nullbucket = (char **) nullbucket[j];
                    free(headbucket);
                    headbucket = nullbucket;
                }
            }
            else
            {
                for( j=0, off=pos ; j < count ; j++, off++)
                    strings[off] = (unsigned char*) node->ptrs[i][j];

                free( node->ptrs[i] );

                if (count > 1)
                {
                    if (count < INSERTBREAK)
                        inssort( strings+pos, off-pos, deep + 1);  
                    else
                        mkqsort( strings+pos, off-pos, deep + 1);
                }
            }
            pos = off;
        }
    }
    free(node);
    return pos; 
}